

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  float value;
  double value_00;
  cpp cVar1;
  long *plVar2;
  size_t sVar3;
  LogMessage *other;
  long lVar4;
  size_type *psVar5;
  char *pcVar6;
  char *pcVar7;
  SubstituteArg *in_stack_fffffffffffffdc8;
  undefined1 local_230 [56];
  undefined1 local_1f8 [48];
  string local_1c8;
  undefined1 local_1a8 [48];
  SubstituteArg local_178;
  SubstituteArg local_148;
  SubstituteArg local_118;
  SubstituteArg local_e8;
  SubstituteArg local_b8;
  SubstituteArg local_88;
  SubstituteArg local_58;
  
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x2c) * 4)) {
  case 1:
    SimpleItoa_abi_cxx11_
              (__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(this + 0x70),(uint)field);
    return __return_storage_ptr__;
  case 2:
    SimpleItoa_abi_cxx11_((string *)local_1f8,*(protobuf **)(this + 0x70),(long)field);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0x2325c0);
    local_230._0_8_ = local_230 + 0x10;
    psVar5 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar5) {
      local_230._16_8_ = *psVar5;
      local_230._24_8_ = plVar2[3];
    }
    else {
      local_230._16_8_ = *psVar5;
      local_230._0_8_ = (size_type *)*plVar2;
    }
    local_230._8_8_ = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append(local_230);
    goto LAB_0019115c;
  case 3:
    SimpleItoa_abi_cxx11_((string *)local_230,(protobuf *)(ulong)*(uint *)(this + 0x70),(uint)field)
    ;
    plVar2 = (long *)std::__cxx11::string::append((char *)local_230);
    goto LAB_00190c67;
  case 4:
    SimpleItoa_abi_cxx11_((string *)local_1f8,*(protobuf **)(this + 0x70),(unsigned_long)field);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0x2325d1);
    local_230._0_8_ = local_230 + 0x10;
    psVar5 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar5) {
      local_230._16_8_ = *psVar5;
      local_230._24_8_ = plVar2[3];
    }
    else {
      local_230._16_8_ = *psVar5;
      local_230._0_8_ = (size_type *)*plVar2;
    }
    local_230._8_8_ = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append(local_230);
LAB_0019115c:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar5) {
      lVar4 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
      operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
    }
    local_1a8._16_8_ = local_1f8._16_8_;
    local_1c8._M_dataplus._M_p = (pointer)local_1f8._0_8_;
    if ((undefined1 *)local_1f8._0_8_ == local_1f8 + 0x10) {
      return __return_storage_ptr__;
    }
LAB_001911c5:
    operator_delete(local_1c8._M_dataplus._M_p,local_1a8._16_8_ + 1);
    return __return_storage_ptr__;
  case 5:
    value_00 = *(double *)(this + 0x70);
    if (value_00 < INFINITY) {
      if (-INFINITY < value_00) {
        if (!NAN(value_00)) {
          SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this,value_00);
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar7 = "::google::protobuf::internal::NaN()";
        pcVar6 = "";
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar7 = "-::google::protobuf::internal::Infinity()";
        pcVar6 = "";
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar7 = "::google::protobuf::internal::Infinity()";
      pcVar6 = "";
    }
    break;
  case 6:
    value = *(float *)(this + 0x70);
    if (value < INFINITY) {
      if (-INFINITY < value) {
        if (!NAN(value)) {
          SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this,value);
          lVar4 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x2326e4,0);
          if (lVar4 == -1) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar7 = "static_cast<float>(::google::protobuf::internal::NaN())";
        pcVar6 = "";
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar7 = "static_cast<float>(-::google::protobuf::internal::Infinity())";
        pcVar6 = "";
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar7 = "static_cast<float>(::google::protobuf::internal::Infinity())";
      pcVar6 = "";
    }
    break;
  case 7:
    cVar1 = this[0x70];
    pcVar7 = "false";
    if ((ulong)(byte)cVar1 != 0) {
      pcVar7 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = pcVar7 + ((ulong)(byte)cVar1 ^ 5);
    break;
  case 8:
    ClassName_abi_cxx11_(&local_1c8,*(cpp **)(this + 0x50),(EnumDescriptor *)0x1,true);
    local_230._0_8_ = local_1c8._M_dataplus._M_p;
    local_230._8_4_ = (undefined4)local_1c8._M_string_length;
    local_1f8._0_8_ = FastInt32ToBuffer(*(int32 *)(*(long *)(this + 0x70) + 0x10),local_1f8 + 0xc);
    sVar3 = strlen((char *)local_1f8._0_8_);
    local_1f8._8_4_ = (undefined4)sVar3;
    local_1a8._0_8_ = (char *)0x0;
    local_1a8._8_4_ = -1;
    local_58.text_ = (char *)0x0;
    local_58.size_ = -1;
    local_88.text_ = (char *)0x0;
    local_88.size_ = -1;
    local_b8.text_ = (char *)0x0;
    local_b8.size_ = -1;
    local_e8.text_ = (char *)0x0;
    local_e8.size_ = -1;
    local_118.text_ = (char *)0x0;
    local_118.size_ = -1;
    local_148.text_ = (char *)0x0;
    local_148.size_ = -1;
    local_178.text_ = (char *)0x0;
    local_178.size_ = -1;
    strings::Substitute_abi_cxx11_
              (__return_storage_ptr__,(strings *)"static_cast< $0 >($1)",local_230,
               (SubstituteArg *)local_1f8,(SubstituteArg *)local_1a8,&local_58,&local_88,&local_b8,
               &local_e8,&local_118,&local_148,&local_178,in_stack_fffffffffffffdc8);
    local_1a8._16_8_ = local_1c8.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p == &local_1c8.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_001911c5;
  case 9:
    CEscape((string *)local_1a8,*(string **)(this + 0x70));
    EscapeTrigraphs((string *)local_1f8,(string *)local_1a8);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0x23cacb);
    psVar5 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar5) {
      local_230._16_8_ = *psVar5;
      local_230._24_8_ = plVar2[3];
      local_230._0_8_ = local_230 + 0x10;
    }
    else {
      local_230._16_8_ = *psVar5;
      local_230._0_8_ = (size_type *)*plVar2;
    }
    local_230._8_8_ = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append(local_230);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar5) {
      lVar4 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
      operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
    }
    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    local_1c8._M_dataplus._M_p = (pointer)local_1a8._0_8_;
    if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
      return __return_storage_ptr__;
    }
    goto LAB_001911c5;
  case 10:
    ClassName_abi_cxx11_((string *)local_230,*(cpp **)(this + 0x48),(Descriptor *)0x1,true);
    plVar2 = (long *)std::__cxx11::string::append((char *)local_230);
LAB_00190c67:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar5) {
      lVar4 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    local_1a8._16_8_ = local_230._16_8_;
    local_1c8._M_dataplus._M_p = (pointer)local_230._0_8_;
    if ((undefined1 *)local_230._0_8_ == local_230 + 0x10) {
      return __return_storage_ptr__;
    }
    goto LAB_001911c5;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_230,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x14d);
    other = internal::LogMessage::operator<<((LogMessage *)local_230,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)local_1f8,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_230);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "";
    pcVar7 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      // gcc rejects the decimal form of kint32min and kint64min.
      if (field->default_value_int32() == kint32min) {
        // Make sure we are in a 2's complement system.
        GOOGLE_COMPILE_ASSERT(kint32min == -0x80000000, kint32min_value_error);
        return "-0x80000000";
      }
      return SimpleItoa(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return SimpleItoa(field->default_value_uint32()) + "u";
    case FieldDescriptor::CPPTYPE_INT64:
      // See the comments for CPPTYPE_INT32.
      if (field->default_value_int64() == kint64min) {
        // Make sure we are in a 2's complement system.
        GOOGLE_COMPILE_ASSERT(kint64min == GOOGLE_LONGLONG(-0x8000000000000000),
                       kint64min_value_error);
        return "GOOGLE_LONGLONG(-0x8000000000000000)";
      }
      return "GOOGLE_LONGLONG(" + SimpleItoa(field->default_value_int64()) + ")";
    case FieldDescriptor::CPPTYPE_UINT64:
      return "GOOGLE_ULONGLONG(" + SimpleItoa(field->default_value_uint64())+ ")";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == numeric_limits<double>::infinity()) {
        return "::google::protobuf::internal::Infinity()";
      } else if (value == -numeric_limits<double>::infinity()) {
        return "-::google::protobuf::internal::Infinity()";
      } else if (value != value) {
        return "::google::protobuf::internal::NaN()";
      } else {
        return SimpleDtoa(value);
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT:
      {
        float value = field->default_value_float();
        if (value == numeric_limits<float>::infinity()) {
          return "static_cast<float>(::google::protobuf::internal::Infinity())";
        } else if (value == -numeric_limits<float>::infinity()) {
          return "static_cast<float>(-::google::protobuf::internal::Infinity())";
        } else if (value != value) {
          return "static_cast<float>(::google::protobuf::internal::NaN())";
        } else {
          string float_value = SimpleFtoa(value);
          // If floating point value contains a period (.) or an exponent
          // (either E or e), then append suffix 'f' to make it a float
          // literal.
          if (float_value.find_first_of(".eE") != string::npos) {
            float_value.push_back('f');
          }
          return float_value;
        }
      }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_ENUM:
      // Lazy:  Generate a static_cast because we don't have a helper function
      //   that constructs the full name of an enum value.
      return strings::Substitute(
          "static_cast< $0 >($1)",
          ClassName(field->enum_type(), true),
          field->default_value_enum()->number());
    case FieldDescriptor::CPPTYPE_STRING:
      return "\"" + EscapeTrigraphs(
        CEscape(field->default_value_string())) +
        "\"";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return FieldMessageTypeName(field) + "::default_instance()";
  }
  // Can't actually get here; make compiler happy.  (We could add a default
  // case above but then we wouldn't get the nice compiler warning when a
  // new type is added.)
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}